

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O1

bool __thiscall
google::protobuf::io::CodedInputStream::ReadVarint32Fallback(CodedInputStream *this,uint32 *value)

{
  long lVar1;
  byte *pbVar2;
  byte *pbVar3;
  uint uVar4;
  byte *pbVar5;
  uint uVar6;
  long lVar7;
  bool bVar8;
  uint64 result;
  uint32 local_10 [2];
  
  pbVar5 = this->buffer_;
  pbVar3 = this->buffer_end_;
  if (((int)pbVar3 - (int)pbVar5 < 10) && ((pbVar3 <= pbVar5 || ((char)pbVar3[-1] < '\0')))) {
    bVar8 = ReadVarint64Fallback(this,(uint64 *)local_10);
    if (!bVar8) {
      return bVar8;
    }
    *value = local_10[0];
    return bVar8;
  }
  uVar4 = *pbVar5 & 0x7f;
  if ((char)*pbVar5 < '\0') {
    uVar4 = uVar4 | (pbVar5[1] & 0x7f) << 7;
    if ((char)pbVar5[1] < '\0') {
      uVar4 = uVar4 | (pbVar5[2] & 0x7f) << 0xe;
      if ((char)pbVar5[2] < '\0') {
        uVar4 = (pbVar5[3] & 0x7f) << 0x15 | uVar4;
        if ((char)pbVar5[3] < '\0') {
          uVar4 = (uint)pbVar5[4] << 0x1c | uVar4;
          if ((char)pbVar5[4] < '\0') {
            pbVar3 = pbVar5 + 6;
            if ((char)pbVar5[5] < '\0') {
              pbVar5 = pbVar5 + 10;
              lVar7 = 0;
              do {
                uVar6 = (uint)lVar7;
                if (uVar6 == 4) goto LAB_0011f675;
                lVar1 = lVar7 + 1;
                pbVar2 = pbVar3 + lVar7;
                lVar7 = lVar1;
              } while ((char)*pbVar2 < '\0');
              pbVar5 = pbVar3 + lVar1;
LAB_0011f675:
              bVar8 = 3 < uVar6;
            }
            else {
              bVar8 = false;
              pbVar5 = pbVar3;
            }
            if (bVar8) {
              pbVar5 = (byte *)0x0;
              goto LAB_0011f600;
            }
          }
          else {
            pbVar5 = pbVar5 + 5;
          }
        }
        else {
          pbVar5 = pbVar5 + 4;
        }
      }
      else {
        pbVar5 = pbVar5 + 3;
      }
    }
    else {
      pbVar5 = pbVar5 + 2;
    }
  }
  else {
    pbVar5 = pbVar5 + 1;
  }
  *value = uVar4;
LAB_0011f600:
  if (pbVar5 != (byte *)0x0) {
    this->buffer_ = pbVar5;
  }
  return pbVar5 != (byte *)0x0;
}

Assistant:

bool CodedInputStream::ReadVarint32Fallback(uint32* value) {
  if (BufferSize() >= kMaxVarintBytes ||
      // Optimization:  If the varint ends at exactly the end of the buffer,
      // we can detect that and still use the fast path.
      (buffer_end_ > buffer_ && !(buffer_end_[-1] & 0x80))) {
    const uint8* end = ReadVarint32FromArray(buffer_, value);
    if (end == NULL) return false;
    buffer_ = end;
    return true;
  } else {
    // Really slow case: we will incur the cost of an extra function call here,
    // but moving this out of line reduces the size of this function, which
    // improves the common case. In micro benchmarks, this is worth about 10-15%
    return ReadVarint32Slow(value);
  }
}